

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QLocale __thiscall QVariant::toLocale(QVariant *this)

{
  QSharedDataPointer<QLocalePrivate> in_RDI;
  QVariant *in_stack_00000028;
  
  qvariant_cast<QLocale>(in_stack_00000028);
  return (QSharedDataPointer<QLocalePrivate>)(QSharedDataPointer<QLocalePrivate>)in_RDI.d.ptr;
}

Assistant:

QLocale QVariant::toLocale() const
{
    return qvariant_cast<QLocale>(*this);
}